

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-threadpool-cancel.c
# Opt level: O0

void saturate_threadpool(void)

{
  int iVar1;
  uv_loop_t *loop_00;
  ulong local_60;
  size_t i;
  char buf [64];
  uv_loop_t *loop;
  
  snprintf((char *)&i,0x40,"UV_THREADPOOL_SIZE=%lu",4);
  putenv((char *)&i);
  loop_00 = uv_default_loop();
  local_60 = 0;
  while( true ) {
    if (3 < local_60) {
      return;
    }
    iVar1 = uv_sem_init(pause_sems + local_60,0);
    if (iVar1 != 0) break;
    iVar1 = uv_queue_work(loop_00,pause_reqs + local_60,work_cb,done_cb);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
              ,0x4d,"0 == uv_queue_work(loop, pause_reqs + i, work_cb, done_cb)");
      abort();
    }
    local_60 = local_60 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-threadpool-cancel.c"
          ,0x4c,"0 == uv_sem_init(pause_sems + i, 0)");
  abort();
}

Assistant:

static void saturate_threadpool(void) {
  uv_loop_t* loop;
  char buf[64];
  size_t i;

  snprintf(buf,
           sizeof(buf),
           "UV_THREADPOOL_SIZE=%lu",
           (unsigned long)ARRAY_SIZE(pause_reqs));
  putenv(buf);

  loop = uv_default_loop();
  for (i = 0; i < ARRAY_SIZE(pause_reqs); i += 1) {
    ASSERT(0 == uv_sem_init(pause_sems + i, 0));
    ASSERT(0 == uv_queue_work(loop, pause_reqs + i, work_cb, done_cb));
  }
}